

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<long_long,_QSocks5BindData_*>_>::moveFromSpan
          (Span<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *this,
          Span<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *fromSpan,size_t fromIndex,
          size_t to)

{
  Entry *pEVar1;
  byte bVar2;
  byte bVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  undefined8 uVar6;
  uchar uVar7;
  
  uVar7 = this->nextFree;
  if (uVar7 == this->allocated) {
    addStorage(this);
    uVar7 = this->nextFree;
  }
  this->offsets[to] = uVar7;
  pEVar4 = this->entries;
  bVar2 = this->nextFree;
  this->nextFree = pEVar4[bVar2].storage.data[0];
  bVar3 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar5 = fromSpan->entries;
  pEVar1 = pEVar5 + bVar3;
  uVar6 = *(undefined8 *)((pEVar1->storage).data + 8);
  pEVar4 = pEVar4 + bVar2;
  *(undefined8 *)(pEVar4->storage).data = *(undefined8 *)(pEVar1->storage).data;
  *(undefined8 *)((pEVar4->storage).data + 8) = uVar6;
  pEVar5[bVar3].storage.data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar3;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }